

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  char *__end;
  bool bVar1;
  Value *pVVar2;
  char *pcVar3;
  ulong local_138;
  bool local_12a;
  bool local_129;
  Value local_120;
  Value local_108;
  Value local_f0;
  uint local_d8;
  UInt digit;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  char local_59;
  ulong uStack_58;
  Char c;
  LargestUInt value;
  LargestUInt threshold;
  LargestUInt maxIntegerValue;
  char *pcStack_38;
  bool isNegative;
  Location current;
  Location inspect;
  Token *pTStack_20;
  bool isDouble;
  Token *token_local;
  Reader *this_local;
  
  inspect._7_1_ = false;
  pTStack_20 = token;
  token_local = (Token *)this;
  for (current = token->start_; current != pTStack_20->end_; current = current + 1) {
    local_129 = true;
    if ((bool)inspect._7_1_ == false) {
      bVar1 = in(*current,'.','e','E','+');
      local_129 = true;
      if (!bVar1) {
        local_12a = false;
        if (*current == '-') {
          local_12a = current != pTStack_20->start_;
        }
        local_129 = local_12a;
      }
    }
    inspect._7_1_ = local_129;
  }
  if ((bool)inspect._7_1_ == false) {
    pcStack_38 = pTStack_20->start_;
    maxIntegerValue._7_1_ = *pcStack_38 == '-';
    if ((bool)maxIntegerValue._7_1_) {
      pcStack_38 = pcStack_38 + 1;
      local_138 = 0x8000000000000000;
    }
    else {
      local_138 = 0xffffffffffffffff;
    }
    threshold = local_138;
    value = local_138 / 10;
    uStack_58 = 0;
    while (pcStack_38 < pTStack_20->end_) {
      pcVar3 = pcStack_38 + 1;
      local_59 = *pcStack_38;
      pcStack_38 = pcVar3;
      if ((local_59 < '0') || ('9' < local_59)) {
        pcVar3 = pTStack_20->start_;
        __end = pTStack_20->end_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>((string *)&local_c0,pcVar3,__end,&local_c1);
        std::operator+(&local_a0,"\'",&local_c0);
        std::operator+(&local_80,&local_a0,"\' is not a number.");
        this_local._7_1_ = addError(this,&local_80,pTStack_20,(Location)0x0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        goto LAB_00172e9a;
      }
      local_d8 = (int)local_59 - 0x30;
      if ((value <= uStack_58) &&
         (((value < uStack_58 || (pcVar3 != pTStack_20->end_)) || (local_138 % 10 < (ulong)local_d8)
          ))) {
        this_local._7_1_ = decodeDouble(this,pTStack_20);
        goto LAB_00172e9a;
      }
      uStack_58 = uStack_58 * 10 + (ulong)local_d8;
    }
    if ((bool)maxIntegerValue._7_1_) {
      Value::Value(&local_f0,-uStack_58);
      pVVar2 = currentValue(this);
      Value::operator=(pVVar2,&local_f0);
      Value::~Value(&local_f0);
    }
    else if (uStack_58 < 0x80000000) {
      Value::Value(&local_108,uStack_58);
      pVVar2 = currentValue(this);
      Value::operator=(pVVar2,&local_108);
      Value::~Value(&local_108);
    }
    else {
      Value::Value(&local_120,uStack_58);
      pVVar2 = currentValue(this);
      Value::operator=(pVVar2,&local_120);
      Value::~Value(&local_120);
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = decodeDouble(this,pTStack_20);
  }
LAB_00172e9a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool 
Reader::decodeNumber( Token &token )
{
   bool isDouble = false;
   for ( Location inspect = token.start_; inspect != token.end_; ++inspect )
   {
      isDouble = isDouble  
                 ||  in( *inspect, '.', 'e', 'E', '+' )  
                 ||  ( *inspect == '-'  &&  inspect != token.start_ );
   }
   if ( isDouble )
      return decodeDouble( token );
   // Attempts to parse the number as an integer. If the number is
   // larger than the maximum supported value of an integer then
   // we decode the number as a double.
   Location current = token.start_;
   bool isNegative = *current == '-';
   if ( isNegative )
      ++current;
   Value::LargestUInt maxIntegerValue = isNegative ? Value::LargestUInt(-Value::minLargestInt) 
                                                   : Value::maxLargestUInt;
   Value::LargestUInt threshold = maxIntegerValue / 10;
   Value::LargestUInt value = 0;
   while ( current < token.end_ )
   {
      Char c = *current++;
      if ( c < '0'  ||  c > '9' )
         return addError( "'" + std::string( token.start_, token.end_ ) + "' is not a number.", token );
      Value::UInt digit(c - '0');
      if ( value >= threshold )
      {
         // We've hit or exceeded the max value divided by 10 (rounded down). If
         // a) we've only just touched the limit, b) this is the last digit, and
         // c) it's small enough to fit in that rounding delta, we're okay.
         // Otherwise treat this number as a double to avoid overflow.
         if (value > threshold ||
             current != token.end_ ||
             digit > maxIntegerValue % 10)
         {
            return decodeDouble( token );
         }
      }
      value = value * 10 + digit;
   }
   if ( isNegative )
      currentValue() = -Value::LargestInt( value );
   else if ( value <= Value::LargestUInt(Value::maxInt) )
      currentValue() = Value::LargestInt( value );
   else
      currentValue() = value;
   return true;
}